

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QNameDatatypeValidator.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::QNameDatatypeValidator::checkContent
          (QNameDatatypeValidator *this,XMLCh *content,ValidationContext *context,bool asBase,
          MemoryManager *manager)

{
  short *psVar1;
  XMLCh *pXVar2;
  short *psVar3;
  char16_t cVar4;
  char16_t cVar5;
  uint uVar6;
  DatatypeValidator *pDVar7;
  RefArrayVectorOf<char16_t> *pRVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_var;
  InvalidDatatypeValueException *pIVar12;
  char16_t *pcVar13;
  char16_t *toDelete;
  char16_t *pcVar14;
  long lVar15;
  char16_t *pcVar16;
  ulong getAt;
  ulong uVar17;
  size_t sVar18;
  ArrayJanitor<char16_t> janEnum;
  ArrayJanitor<char16_t> jan;
  char16_t *local_78;
  ArrayJanitor<char16_t> local_50;
  ArrayJanitor<char16_t> local_40;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  pDVar7 = (this->super_AbstractStringValidator).super_DatatypeValidator.fBaseValidator;
  if (pDVar7 != (DatatypeValidator *)0x0) {
    (*(pDVar7->super_XSerializable)._vptr_XSerializable[0x14])(pDVar7,content,context,1,manager);
  }
  uVar6 = (this->super_AbstractStringValidator).super_DatatypeValidator.fFacetsDefined;
  if (((uVar6 & 8) != 0) &&
     (bVar9 = RegularExpression::matches
                        ((this->super_AbstractStringValidator).super_DatatypeValidator.fRegex,
                         content,manager), !bVar9)) {
    pIVar12 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
    InvalidDatatypeValueException::InvalidDatatypeValueException
              (pIVar12,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/QNameDatatypeValidator.cpp"
               ,0x6c,VALUE_NotMatch_Pattern,content,
               (this->super_AbstractStringValidator).super_DatatypeValidator.fPattern,(XMLCh *)0x0,
               (XMLCh *)0x0,manager);
    __cxa_throw(pIVar12,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
  }
  if (!asBase) {
    (*(this->super_AbstractStringValidator).super_DatatypeValidator.super_XSerializable.
      _vptr_XSerializable[0x11])(this,content,manager);
    uVar17 = 0;
    ArrayJanitor<char16_t>::ArrayJanitor(&local_40,(char16_t *)0x0,manager);
    local_78 = (char16_t *)0x0;
    if (context != (ValidationContext *)0x0) {
      if (content == (XMLCh *)0x0) {
        local_78 = (char16_t *)0x0;
      }
      else {
        sVar18 = 0;
        do {
          psVar1 = (short *)((long)content + sVar18);
          sVar18 = sVar18 + 2;
        } while (*psVar1 != 0);
        iVar10 = (*manager->_vptr_MemoryManager[3])(manager,sVar18);
        local_78 = (char16_t *)CONCAT44(extraout_var,iVar10);
        memcpy(local_78,content,sVar18);
      }
      ArrayJanitor<char16_t>::reset(&local_40,local_78,manager);
      (*(this->super_AbstractStringValidator).super_DatatypeValidator.super_XSerializable.
        _vptr_XSerializable[0x16])(this,local_78,manager);
      uVar11 = XMLString::indexOf(content,L':');
      uVar17 = (ulong)uVar11;
      if (0 < (int)uVar11) {
        local_78[uVar17] = L'\0';
        iVar10 = (*context->_vptr_ValidationContext[0xd])(context);
        if ((char)iVar10 != '\0') {
          pIVar12 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
          InvalidDatatypeValueException::InvalidDatatypeValueException
                    (pIVar12,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/QNameDatatypeValidator.cpp"
                     ,0x87,VALUE_QName_Invalid2,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                     manager);
          __cxa_throw(pIVar12,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
        }
      }
    }
    if (((uVar6 & 0x10) != 0) &&
       (pRVar8 = (this->super_AbstractStringValidator).fEnumeration,
       pRVar8 != (RefArrayVectorOf<char16_t> *)0x0 && context != (ValidationContext *)0x0)) {
      pcVar16 = local_78 + uVar17 + 1;
      if ((int)uVar17 < 1) {
        pcVar16 = local_78;
      }
      uVar17 = (pRVar8->super_BaseRefVectorOf<char16_t>).fCurCount;
      if (uVar17 == 0) {
        getAt = 0;
      }
      else {
        pcVar14 = (char16_t *)0x0;
        bVar9 = false;
        getAt = 0;
        do {
          pcVar13 = BaseRefVectorOf<char16_t>::elementAt
                              (&((this->super_AbstractStringValidator).fEnumeration)->
                                super_BaseRefVectorOf<char16_t>,getAt);
          if (pcVar13 == (char16_t *)0x0) {
            toDelete = (XMLCh *)0x0;
          }
          else {
            sVar18 = 0;
            do {
              psVar1 = (short *)((long)pcVar13 + sVar18);
              sVar18 = sVar18 + 2;
            } while (*psVar1 != 0);
            iVar10 = (*manager->_vptr_MemoryManager[3])(manager,sVar18);
            toDelete = (char16_t *)CONCAT44(extraout_var_00,iVar10);
            memcpy(toDelete,pcVar13,sVar18);
          }
          ArrayJanitor<char16_t>::ArrayJanitor(&local_50,toDelete,manager);
          iVar10 = XMLString::indexOf(toDelete,L':',0,manager);
          if (iVar10 != -1) {
            pXVar2 = toDelete + iVar10;
            toDelete = pXVar2 + 1;
            *pXVar2 = L'\0';
          }
          if (pcVar16 == toDelete) {
LAB_002fb6de:
            if (-1 < iVar10) {
              if (!bVar9) {
                iVar10 = (*context->_vptr_ValidationContext[0xf])(context,local_78);
                pcVar14 = (char16_t *)CONCAT44(extraout_var_01,iVar10);
              }
              pcVar13 = BaseRefVectorOf<char16_t>::elementAt
                                  (&((this->super_AbstractStringValidator).fEnumeration)->
                                    super_BaseRefVectorOf<char16_t>,getAt | 1);
              if (pcVar14 != pcVar13) {
                if (pcVar13 != (char16_t *)0x0 && pcVar14 != (char16_t *)0x0) {
                  lVar15 = 0;
                  do {
                    psVar1 = (short *)((long)pcVar14 + lVar15);
                    if (*psVar1 == 0) {
                      pcVar13 = (char16_t *)((long)pcVar13 + lVar15);
                      goto LAB_002fb780;
                    }
                    psVar3 = (short *)((long)pcVar13 + lVar15);
                    lVar15 = lVar15 + 2;
                  } while (*psVar1 == *psVar3);
                  bVar9 = true;
                  goto LAB_002fb78d;
                }
                if (pcVar14 == (char16_t *)0x0) {
                  if (pcVar13 == (char16_t *)0x0) goto LAB_002fb7a8;
LAB_002fb780:
                  cVar4 = *pcVar13;
                }
                else {
                  cVar4 = *pcVar14;
                  if ((pcVar13 != (char16_t *)0x0) && (cVar4 == L'\0')) goto LAB_002fb780;
                }
                bVar9 = true;
                if (cVar4 != L'\0') goto LAB_002fb78d;
              }
            }
LAB_002fb7a8:
            ArrayJanitor<char16_t>::~ArrayJanitor(&local_50);
            break;
          }
          if ((pcVar16 == (char16_t *)0x0) || (pcVar13 = pcVar16, toDelete == (char16_t *)0x0)) {
            if (pcVar16 == (char16_t *)0x0) {
              if (toDelete == (char16_t *)0x0) goto LAB_002fb6de;
LAB_002fb6d2:
              cVar4 = *toDelete;
            }
            else {
              cVar4 = *pcVar16;
              if ((toDelete != (char16_t *)0x0) && (cVar4 == L'\0')) goto LAB_002fb6d2;
            }
            if (cVar4 == L'\0') goto LAB_002fb6de;
          }
          else {
            do {
              cVar4 = *pcVar13;
              if (cVar4 == L'\0') goto LAB_002fb6d2;
              cVar5 = *toDelete;
              pcVar13 = pcVar13 + 1;
              toDelete = toDelete + 1;
            } while (cVar4 == cVar5);
          }
LAB_002fb78d:
          ArrayJanitor<char16_t>::~ArrayJanitor(&local_50);
          getAt = getAt + 2;
        } while (getAt < uVar17);
      }
      if (getAt == uVar17) {
        pIVar12 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeValueException::InvalidDatatypeValueException
                  (pIVar12,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/QNameDatatypeValidator.cpp"
                   ,0xd2,VALUE_NotIn_Enumeration,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   manager);
        __cxa_throw(pIVar12,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
      }
    }
    (*(this->super_AbstractStringValidator).super_DatatypeValidator.super_XSerializable.
      _vptr_XSerializable[0xf])(this,content,manager);
    ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
  }
  return;
}

Assistant:

void QNameDatatypeValidator::checkContent( const XMLCh*             const content
                                          ,       ValidationContext* const context
                                          ,       bool                     asBase
                                          ,       MemoryManager*     const manager
                                          )
{

    //validate against base validator if any
    QNameDatatypeValidator *pBaseValidator = (QNameDatatypeValidator*) this->getBaseValidator();
    if (pBaseValidator)
        pBaseValidator->checkContent(content, context, true, manager);

    int thisFacetsDefined = getFacetsDefined();

    // we check pattern first
    if ( (thisFacetsDefined & DatatypeValidator::FACET_PATTERN ) != 0 )
    {
        if (getRegex()->matches(content, manager) ==false)
        {
            ThrowXMLwithMemMgr2(InvalidDatatypeValueException
                    , XMLExcepts::VALUE_NotMatch_Pattern
                    , content
                    , getPattern()
                    , manager);
        }
    }

    // if this is a base validator, we only need to check pattern facet
    // all other facet were inherited by the derived type
    if (asBase)
        return;

    checkValueSpace(content, manager);

    int colonPos = 0;
    XMLCh* prefix = 0;    
    ArrayJanitor<XMLCh>  jan(prefix, manager);

    if (context) {
        prefix = XMLString::replicate(content, manager);
        jan.reset(prefix, manager);
        normalizeContent(prefix, manager);

        colonPos = XMLString::indexOf(content, chColon);
        if (colonPos > 0) {                        
            prefix[colonPos] = chNull;                     
            if (context->isPrefixUnknown(prefix)) {
                ThrowXMLwithMemMgr1(InvalidDatatypeValueException
                    , XMLExcepts::VALUE_QName_Invalid2
                    , content
                    , manager);             
            }                                  
        }
    }

#if 0
    if ((thisFacetsDefined & DatatypeValidator::FACET_ENUMERATION) != 0 &&
        (getEnumeration() != 0))
    {
        XMLCh* normContent = XMLString::replicate(content, manager);
        ArrayJanitor<XMLCh>  jan(normContent, manager);
        normalizeContent(normContent, manager);

        int i=0;
        int enumLength = getEnumeration()->size();
        for ( ; i < enumLength; i++)
        {
            if (XMLString::equals(normContent, getEnumeration()->elementAt(i)))
                break;
        }

        if (i == enumLength)
            ThrowXMLwithMemMgr1(InvalidDatatypeValueException, XMLExcepts::VALUE_NotIn_Enumeration, content, manager);
    }


#else
    if ((thisFacetsDefined & DatatypeValidator::FACET_ENUMERATION) != 0 &&
        (getEnumeration() != 0) && context)
    {
        XMLCh* localName;
        if (colonPos > 0) {
            localName = prefix + colonPos + 1;
        }
        else {
            localName = prefix;
        }

        XMLCh* enumPrefix;
        XMLCh* enumLocalName;
        XMLSize_t i=0;
        XMLSize_t enumLength = getEnumeration()->size();
        bool foundURIId = false;
        const XMLCh* normURI = 0;
		// The +=2 is because the enumeration has prefix:localname as one entry followed
		// by the URI string for the prefix as the next entry.
        for ( ; i < enumLength; i+=2)
        {            
            enumPrefix = XMLString::replicate(getEnumeration()->elementAt(i), manager);
            ArrayJanitor<XMLCh>  janEnum(enumPrefix, manager);
            colonPos = XMLString::indexOf(enumPrefix, chColon, 0, manager);
            
            if (colonPos != -1) {
                enumLocalName = enumPrefix + colonPos + 1;
                enumPrefix[colonPos] = chNull;
            }
            else {
                enumLocalName = enumPrefix;
            }
            
            if (XMLString::equals(localName, enumLocalName)) {               
				if (colonPos < 0)
					break;

                // now need to see if the prefix URI's are the same                
                if (!foundURIId) {                    
                    normURI = context->getURIForPrefix(prefix);                                       
                    foundURIId = true;
                }
				if (XMLString::equals(normURI, getEnumeration()->elementAt(i+1)))
					break;
            }        
        }

        if (i == enumLength)
            ThrowXMLwithMemMgr1(InvalidDatatypeValueException, XMLExcepts::VALUE_NotIn_Enumeration, content, manager);
    }
#endif

    checkAdditionalFacet(content, manager);
}